

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_stbvorbis_init_file
                    (char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_stbvorbis *pVorbis)

{
  undefined4 uVar1;
  undefined4 uVar2;
  stb_vorbis *psVar3;
  ma_data_source_base *pDataSourceBase;
  ma_result mVar4;
  
  if (pVorbis == (ma_stbvorbis *)0x0) {
    mVar4 = MA_INVALID_ARGS;
  }
  else {
    memset(pVorbis,0,0xe0);
    pVorbis->format = ma_format_f32;
    (pVorbis->ds).vtable = (ma_data_source_vtable *)0x0;
    (pVorbis->ds).rangeBegInFrames = 0;
    (pVorbis->ds).rangeEndInFrames = 0;
    (pVorbis->ds).loopBegInFrames = 0;
    (pVorbis->ds).loopEndInFrames = 0;
    (pVorbis->ds).pCurrent = (ma_data_source *)0x0;
    (pVorbis->ds).pNext = (ma_data_source *)0x0;
    (pVorbis->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    *(undefined8 *)&(pVorbis->ds).isLooping = 0;
    (pVorbis->ds).vtable = &g_ma_stbvorbis_ds_vtable;
    (pVorbis->ds).rangeBegInFrames = 0;
    (pVorbis->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pVorbis->ds).loopBegInFrames = 0;
    (pVorbis->ds).loopEndInFrames = 0xffffffffffffffff;
    (pVorbis->ds).pCurrent = pVorbis;
    mVar4 = MA_SUCCESS;
    psVar3 = stb_vorbis_open_filename(pFilePath,(int *)0x0,(stb_vorbis_alloc *)0x0);
    pVorbis->stb = psVar3;
    if (psVar3 == (stb_vorbis *)0x0) {
      mVar4 = MA_INVALID_FILE;
    }
    else {
      pVorbis->usingPushMode = 0;
      uVar1 = psVar3->sample_rate;
      uVar2 = psVar3->channels;
      pVorbis->channels = uVar2;
      pVorbis->sampleRate = uVar1;
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_stbvorbis_init_file(const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_stbvorbis* pVorbis)
{
    ma_result result;

    result = ma_stbvorbis_init_internal(pConfig, pVorbis);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_VORBIS)
    {
        (void)pAllocationCallbacks; /* Don't know how to make use of this with stb_vorbis. */

        /* We can use stb_vorbis' pull mode for file based streams. */
        pVorbis->stb = stb_vorbis_open_filename(pFilePath, NULL, NULL);
        if (pVorbis->stb == NULL) {
            return MA_INVALID_FILE;
        }

        pVorbis->usingPushMode = MA_FALSE;

        result = ma_stbvorbis_post_init(pVorbis);
        if (result != MA_SUCCESS) {
            stb_vorbis_close(pVorbis->stb);
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. */
        (void)pFilePath;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}